

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O1

void __thiscall NaPNStatistics::allocate_resources(NaPNStatistics *this)

{
  NaPetriCnInput *this_00;
  uint uVar1;
  NaVector *pNVar2;
  
  this_00 = &this->signal;
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->Mean,uVar1);
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->StdDev,uVar1);
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->RMS,uVar1);
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->Min,uVar1);
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->Max,uVar1);
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->Sum,uVar1);
  pNVar2 = NaPetriCnInput::data(this_00);
  uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
  NaVector::new_dim(&this->Sum2,uVar1);
  return;
}

Assistant:

void
NaPNStatistics::allocate_resources ()
{
    Mean.new_dim(signal.data().dim());
    StdDev.new_dim(signal.data().dim());
    RMS.new_dim(signal.data().dim());
    Min.new_dim(signal.data().dim());
    Max.new_dim(signal.data().dim());

    Sum.new_dim(signal.data().dim());
    Sum2.new_dim(signal.data().dim());
}